

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

void phmap::priv::
     map_slot_policy<unsigned_long,phmap::flat_hash_set<unsigned_long,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<unsigned_long>>>
     ::
     transfer<std::allocator<std::pair<unsigned_long_const,phmap::flat_hash_set<unsigned_long,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<unsigned_long>>>>>
               (allocator<std::pair<const_unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  std::
  pair<unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>
  ::pair((pair<unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>
          *)&new_slot->value,
         (pair<unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>
          *)&old_slot->value);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~raw_hash_set(&(old_slot->value).second.
                   super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
                 );
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
			                     slot_type* old_slot)
			{
				emplace(new_slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(
					    *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
					        std::move(old_slot->value));
				}
				destroy(alloc, old_slot);
			}